

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
psy::C::Compilation::CompilationImpl::CompilationImpl(CompilationImpl *this,Compilation *q)

{
  VoidType *this_00;
  BasicType *pBVar1;
  ErrorType *this_01;
  ProgramSymbol *this_02;
  
  this->Q_ = q;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  (this->id_)._M_string_length = 0;
  (this->id_).field_2._M_local_buf[0] = '\0';
  PlatformOptions::PlatformOptions(&this->platformOpts_);
  InferenceOptions::InferenceOptions(&this->inferOpts_);
  this_00 = (VoidType *)operator_new(0x10);
  VoidType::VoidType(this_00);
  (this->tyVoid_)._M_t.
  super___uniq_ptr_impl<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::VoidType_*,_std::default_delete<psy::C::VoidType>_>.
  super__Head_base<0UL,_psy::C::VoidType_*,_false>._M_head_impl = this_00;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Char);
  (this->tyChar_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Char_S);
  (this->tyCharS_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Char_U);
  (this->tyCharU_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Short_S);
  (this->tyShortS_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Short_U);
  (this->tyShortU_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Int_S);
  (this->tyIntS_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Int_U);
  (this->tyIntU_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Long_S);
  (this->tyLongS_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Long_U);
  (this->tyLongU_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongLong_S);
  (this->tyLongLongS_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongLong_U);
  (this->tyLongLongU_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Float);
  (this->tyFloat_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Double);
  (this->tyDouble_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongDouble);
  (this->tyLongDouble_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,FloatComplex);
  (this->tyFloatComplex_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,DoubleComplex);
  (this->tyDoubleComplex_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongDoubleComplex);
  (this->tyLongDoubleComplex_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Bool);
  (this->tyBool_)._M_t.
  super___uniq_ptr_impl<psy::C::BasicType,_std::default_delete<psy::C::BasicType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::BasicType_*,_std::default_delete<psy::C::BasicType>_>.
  super__Head_base<0UL,_psy::C::BasicType_*,_false>._M_head_impl = pBVar1;
  this_01 = (ErrorType *)operator_new(0x10);
  ErrorType::ErrorType(this_01);
  (this->tyErr_)._M_t.
  super___uniq_ptr_impl<psy::C::ErrorType,_std::default_delete<psy::C::ErrorType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::ErrorType_*,_std::default_delete<psy::C::ErrorType>_>.
  super__Head_base<0UL,_psy::C::ErrorType_*,_false>._M_head_impl = this_01;
  this_02 = (ProgramSymbol *)operator_new(0x10);
  ProgramSymbol::ProgramSymbol(this_02);
  (this->prog_)._M_t.
  super___uniq_ptr_impl<psy::C::ProgramSymbol,_std::default_delete<psy::C::ProgramSymbol>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::ProgramSymbol_*,_std::default_delete<psy::C::ProgramSymbol>_>.
  super__Head_base<0UL,_psy::C::ProgramSymbol_*,_false>._M_head_impl = this_02;
  (this->isDirty_)._M_h._M_buckets = &(this->isDirty_)._M_h._M_single_bucket;
  (this->isDirty_)._M_h._M_bucket_count = 1;
  (this->isDirty_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->isDirty_)._M_h._M_element_count = 0;
  (this->isDirty_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->isDirty_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->isDirty_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->semaModels_)._M_h._M_buckets = &(this->semaModels_)._M_h._M_single_bucket;
  (this->semaModels_)._M_h._M_bucket_count = 1;
  (this->semaModels_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->semaModels_)._M_h._M_element_count = 0;
  (this->semaModels_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->semaModels_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->semaModels_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

CompilationImpl(Compilation* q)
        : Q_(q)
        , tyVoid_(new VoidType)
        , tyChar_(new BasicType(BasicTypeKind::Char))
        , tyCharS_(new BasicType(BasicTypeKind::Char_S))
        , tyCharU_(new BasicType(BasicTypeKind::Char_U))
        , tyShortS_(new BasicType(BasicTypeKind::Short_S))
        , tyShortU_(new BasicType(BasicTypeKind::Short_U))
        , tyIntS_(new BasicType(BasicTypeKind::Int_S))
        , tyIntU_(new BasicType(BasicTypeKind::Int_U))
        , tyLongS_(new BasicType(BasicTypeKind::Long_S))
        , tyLongU_(new BasicType(BasicTypeKind::Long_U))
        , tyLongLongS_(new BasicType(BasicTypeKind::LongLong_S))
        , tyLongLongU_(new BasicType(BasicTypeKind::LongLong_U))
        , tyFloat_(new BasicType(BasicTypeKind::Float))
        , tyDouble_(new BasicType(BasicTypeKind::Double))
        , tyLongDouble_(new BasicType(BasicTypeKind::LongDouble))
        , tyFloatComplex_(new BasicType(BasicTypeKind::FloatComplex))
        , tyDoubleComplex_(new BasicType(BasicTypeKind::DoubleComplex))
        , tyLongDoubleComplex_(new BasicType(BasicTypeKind::LongDoubleComplex))
        , tyBool_(new BasicType(BasicTypeKind::Bool))
        , tyErr_(new ErrorType())
        , prog_(new ProgramSymbol)
    {}